

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cpp
# Opt level: O3

void __thiscall BackendBase::setDefaultChannelOrder(BackendBase *this)

{
  ALCdevice *pAVar1;
  
  pAVar1 = this->mDevice;
  (pAVar1->RealOut).ChannelIndex._M_elems[0xc] = 0xffffffff;
  (pAVar1->RealOut).ChannelIndex._M_elems[0xd] = 0xffffffff;
  (pAVar1->RealOut).ChannelIndex._M_elems[0xe] = 0xffffffff;
  (pAVar1->RealOut).ChannelIndex._M_elems[0xf] = 0xffffffff;
  (pAVar1->RealOut).ChannelIndex._M_elems[8] = 0xffffffff;
  (pAVar1->RealOut).ChannelIndex._M_elems[9] = 0xffffffff;
  (pAVar1->RealOut).ChannelIndex._M_elems[10] = 0xffffffff;
  (pAVar1->RealOut).ChannelIndex._M_elems[0xb] = 0xffffffff;
  (pAVar1->RealOut).ChannelIndex._M_elems[4] = 0xffffffff;
  (pAVar1->RealOut).ChannelIndex._M_elems[5] = 0xffffffff;
  (pAVar1->RealOut).ChannelIndex._M_elems[6] = 0xffffffff;
  (pAVar1->RealOut).ChannelIndex._M_elems[7] = 0xffffffff;
  (pAVar1->RealOut).ChannelIndex._M_elems[0] = 0xffffffff;
  (pAVar1->RealOut).ChannelIndex._M_elems[1] = 0xffffffff;
  (pAVar1->RealOut).ChannelIndex._M_elems[2] = 0xffffffff;
  (pAVar1->RealOut).ChannelIndex._M_elems[3] = 0xffffffff;
  switch(pAVar1->FmtChans) {
  case DevFmtMono:
  case DevFmtChannelsDefault:
  case DevFmtQuad:
  case DevFmtX51:
  case DevFmtX61:
  case DevFmtAmbi3D:
    setDefaultWFXChannelOrder(this);
    return;
  case DevFmtX71:
    (pAVar1->RealOut).ChannelIndex._M_elems[4] = 2;
    (pAVar1->RealOut).ChannelIndex._M_elems[5] = 3;
    (pAVar1->RealOut).ChannelIndex._M_elems[0] = 0;
    (pAVar1->RealOut).ChannelIndex._M_elems[1] = 1;
    (pAVar1->RealOut).ChannelIndex._M_elems[2] = 4;
    (pAVar1->RealOut).ChannelIndex._M_elems[3] = 5;
    (pAVar1->RealOut).ChannelIndex._M_elems[7] = 6;
    (pAVar1->RealOut).ChannelIndex._M_elems[8] = 7;
    return;
  case DevFmtX51Rear:
    (pAVar1->RealOut).ChannelIndex._M_elems[4] = 2;
    (pAVar1->RealOut).ChannelIndex._M_elems[5] = 3;
    (pAVar1->RealOut).ChannelIndex._M_elems[0] = 0;
    (pAVar1->RealOut).ChannelIndex._M_elems[1] = 1;
    (pAVar1->RealOut).ChannelIndex._M_elems[2] = 4;
    (pAVar1->RealOut).ChannelIndex._M_elems[3] = 5;
  }
  return;
}

Assistant:

void BackendBase::setDefaultChannelOrder()
{
    mDevice->RealOut.ChannelIndex.fill(INVALID_CHANNEL_INDEX);

    switch(mDevice->FmtChans)
    {
    case DevFmtX51Rear:
        mDevice->RealOut.ChannelIndex[FrontLeft]   = 0;
        mDevice->RealOut.ChannelIndex[FrontRight]  = 1;
        mDevice->RealOut.ChannelIndex[BackLeft]    = 2;
        mDevice->RealOut.ChannelIndex[BackRight]   = 3;
        mDevice->RealOut.ChannelIndex[FrontCenter] = 4;
        mDevice->RealOut.ChannelIndex[LFE]         = 5;
        return;
    case DevFmtX71:
        mDevice->RealOut.ChannelIndex[FrontLeft]   = 0;
        mDevice->RealOut.ChannelIndex[FrontRight]  = 1;
        mDevice->RealOut.ChannelIndex[BackLeft]    = 2;
        mDevice->RealOut.ChannelIndex[BackRight]   = 3;
        mDevice->RealOut.ChannelIndex[FrontCenter] = 4;
        mDevice->RealOut.ChannelIndex[LFE]         = 5;
        mDevice->RealOut.ChannelIndex[SideLeft]    = 6;
        mDevice->RealOut.ChannelIndex[SideRight]   = 7;
        return;

    /* Same as WFX order */
    case DevFmtMono:
    case DevFmtStereo:
    case DevFmtQuad:
    case DevFmtX51:
    case DevFmtX61:
    case DevFmtAmbi3D:
        setDefaultWFXChannelOrder();
        break;
    }
}